

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::EmptyConstraintPS::EmptyConstraintPS
          (EmptyConstraintPS *this,SPxLPBase<double> *lp,int _i,shared_ptr<soplex::Tolerances> *tols
          )

{
  int iVar1;
  int nR;
  int *piVar2;
  shared_ptr<soplex::Tolerances> *in_RCX;
  undefined4 in_EDX;
  char *in_RDI;
  double dVar3;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff98;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc4;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2b8772);
  nR = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b8782);
  PostStep::PostStep((PostStep *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),in_RDI,in_RCX,nR,
                     in_stack_ffffffffffffffa8);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b87b4);
  *(undefined ***)in_RDI = &PTR__EmptyConstraintPS_004ecb90;
  *(undefined4 *)(in_RDI + 0x28) = in_EDX;
  piVar2 = (int *)(in_RDI + 0x2c);
  iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2b87e1);
  *piVar2 = iVar1 + -1;
  dVar3 = SPxLPBase<double>::rowObj
                    ((SPxLPBase<double> *)CONCAT44(nR,iVar1),(int)((ulong)piVar2 >> 0x20));
  *(double *)(in_RDI + 0x30) = dVar3;
  return;
}

Assistant:

EmptyConstraintPS(const SPxLPBase<R>& lp, int _i, std::shared_ptr<Tolerances> tols)
         : PostStep("EmptyConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_row_obj(lp.rowObj(_i))
      {}